

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

Result __thiscall
testing::Action<void_(const_mp::NLProblemInfo_&)>::Perform
          (Action<void_(const_mp::NLProblemInfo_&)> *this,ArgumentTuple *args)

{
  ActionInterface<void_(const_mp::NLProblemInfo_&)> *pAVar1;
  FailureReporterInterface *pFVar2;
  long *local_40 [2];
  long local_30 [2];
  
  pAVar1 = (this->impl_).value_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,"");
  if (pAVar1 == (ActionInterface<void_(const_mp::NLProblemInfo_&)> *)0x0) {
    pFVar2 = internal::GetFailureReporter();
    (*pFVar2->_vptr_FailureReporterInterface[2])
              (pFVar2,1,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/../thirdparty/gmock/gmock.h"
               ,0x4c3,local_40);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pAVar1 = (this->impl_).value_;
  (**(code **)(*(long *)pAVar1 + 0x10))(pAVar1,args);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }